

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# munkres.hxx
# Opt level: O3

void __thiscall
markurem::matching::
Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
::clear_covers(Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
               *this)

{
  ulong *puVar1;
  _Bit_type *p_Var2;
  byte bVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  p_Var2 = (this->row_cover).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  uVar5 = ((long)(this->row_cover).super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p - (long)p_Var2) *
          8 + (ulong)(this->row_cover).super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
  if (uVar5 != 0) {
    uVar4 = 0;
    do {
      uVar6 = uVar4 + 0x3f;
      if (-1 < (long)uVar4) {
        uVar6 = uVar4;
      }
      bVar3 = (byte)uVar4 & 0x3f;
      puVar1 = p_Var2 + ((long)uVar6 >> 6) +
                        (ulong)((uVar4 & 0x800000000000003f) < 0x8000000000000001) +
                        0xffffffffffffffff;
      *puVar1 = *puVar1 & (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
      uVar4 = uVar4 + 1;
    } while (uVar4 < uVar5);
  }
  p_Var2 = (this->col_cover).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  uVar5 = ((long)(this->col_cover).super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p - (long)p_Var2) *
          8 + (ulong)(this->col_cover).super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
  if (uVar5 != 0) {
    uVar4 = 0;
    do {
      uVar6 = uVar4 + 0x3f;
      if (-1 < (long)uVar4) {
        uVar6 = uVar4;
      }
      bVar3 = (byte)uVar4 & 0x3f;
      puVar1 = p_Var2 + ((long)uVar6 >> 6) +
                        (ulong)((uVar4 & 0x800000000000003f) < 0x8000000000000001) +
                        0xffffffffffffffff;
      *puVar1 = *puVar1 & (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
      uVar4 = uVar4 + 1;
    } while (uVar4 < uVar5);
  }
  return;
}

Assistant:

void
Matching<GRAPH, COST, MASK>::clear_covers()
{
    for (Index row = 0; row < row_cover.size(); ++row) {
        row_cover[row] = false;
    }
    for (Index col = 0; col < col_cover.size(); ++col) {
        col_cover[col] = false;
    }
}